

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O3

void __thiscall QPDF::read_xref(QPDF *this,qpdf_offset_t xref_offset)

{
  _Rb_tree_header *p_Var1;
  size_t sVar2;
  uint uVar3;
  long lVar4;
  long *plVar5;
  undefined8 *puVar6;
  _Base_ptr p_Var7;
  QPDFExc *pQVar8;
  uint uVar9;
  uint uVar10;
  long *plVar11;
  ulong *puVar12;
  size_type *psVar13;
  _Base_ptr p_Var14;
  ulong uVar15;
  _Base_ptr p_Var16;
  _Base_ptr p_Var17;
  uint uVar18;
  uint uVar19;
  bool bVar20;
  uint uVar21;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var22;
  ulong uVar23;
  char buf [7];
  string __str_1;
  string __str;
  char ch;
  set<long_long,_std::less<long_long>,_std::allocator<long_long>_> visited;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> free_table;
  undefined1 local_1f8 [32];
  long local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  long local_1c0;
  undefined8 uStack_1b8;
  string local_1b0;
  ulong *local_190;
  long local_188;
  ulong local_180;
  long lStack_178;
  ulong *local_170;
  long local_168;
  ulong local_160 [2];
  long *local_150;
  long local_148;
  long local_140;
  long lStack_138;
  long *local_130 [2];
  long local_120 [2];
  undefined1 local_110 [128];
  _Rb_tree<long_long,_long_long,_std::_Identity<long_long>,_std::less<long_long>,_std::allocator<long_long>_>
  local_90;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &local_90._M_impl.super__Rb_tree_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1d8 = xref_offset;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (xref_offset != 0) {
    do {
      std::
      _Rb_tree<long_long,long_long,std::_Identity<long_long>,std::less<long_long>,std::allocator<long_long>>
      ::_M_insert_unique<long_long_const&>
                ((_Rb_tree<long_long,long_long,std::_Identity<long_long>,std::less<long_long>,std::allocator<long_long>>
                  *)&local_90,&local_1d8);
      local_1d0 = (long *)((ulong)local_1d0 & 0xff00000000000000);
      plVar5 = *(long **)&(((this->m)._M_t.
                            super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                            .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                          super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
      (**(code **)(*plVar5 + 0x28))(plVar5,local_1d8,0);
      bVar20 = false;
      while (plVar5 = *(long **)&(((this->m)._M_t.
                                   super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                   .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                                 file).super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>,
            lVar4 = (**(code **)(*plVar5 + 0x38))(plVar5,(QPDFExc *)local_110,1), lVar4 == 1) {
        if ((4 < (byte)local_110[0] - 9) && (local_110[0] != (runtime_error)0x20)) {
          plVar5 = *(long **)&(((this->m)._M_t.
                                super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                              super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
          (**(code **)(*plVar5 + 0x40))(plVar5,(int)(char)local_110[0]);
          break;
        }
        bVar20 = true;
      }
      plVar5 = *(long **)&(((this->m)._M_t.
                            super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                            .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                          super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
      (**(code **)(*plVar5 + 0x38))(plVar5,&local_1d0,6);
      if (((int)local_1d0 == 0x66657278) && ((local_1d0._4_1_ - 9 < 5 || (local_1d0._4_1_ == 0x20)))
         ) {
        if (bVar20) {
          local_1f8._0_8_ = local_1f8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"");
          local_1b0._M_dataplus._M_p = (pointer)((long)&local_1b0 + 0x10);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1b0,"extraneous whitespace seen before xref","");
          damagedPDF((QPDFExc *)local_110,this,(string *)local_1f8,-1,&local_1b0);
          warn(this,(QPDFExc *)local_110);
          QPDFExc::~QPDFExc((QPDFExc *)local_110);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((long)&local_1b0 + 0x10U)) {
            operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
          }
          if ((element_type *)local_1f8._0_8_ != (element_type *)(local_1f8 + 0x10)) {
            operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
          }
        }
        for (lVar4 = 4;
            (*(byte *)((long)&local_1d0 + lVar4) - 9 < 5 ||
            (*(byte *)((long)&local_1d0 + lVar4) == 0x20)); lVar4 = lVar4 + 1) {
        }
        local_1d8 = read_xrefTable(this,lVar4 + local_1d8);
      }
      else {
        local_1d8 = read_xrefStream(this,local_1d8);
      }
      p_Var7 = local_90._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var17 = &p_Var1->_M_header;
      if (local_90._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        do {
          p_Var16 = p_Var17;
          p_Var14 = p_Var7;
          sVar2 = *(size_t *)(p_Var14 + 1);
          p_Var17 = p_Var14;
          if ((long)sVar2 < local_1d8) {
            p_Var17 = p_Var16;
          }
          p_Var7 = (&p_Var14->_M_left)[(long)sVar2 < local_1d8];
        } while ((&p_Var14->_M_left)[(long)sVar2 < local_1d8] != (_Base_ptr)0x0);
        if ((_Rb_tree_header *)p_Var17 != p_Var1) {
          if ((long)sVar2 < local_1d8) {
            p_Var14 = p_Var16;
          }
          if ((long)*(size_t *)(p_Var14 + 1) <= local_1d8) {
            pQVar8 = (QPDFExc *)__cxa_allocate_exception(0x80);
            local_110._0_8_ = local_110 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"");
            local_1f8._0_8_ = local_1f8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1f8,"loop detected following xref tables","");
            damagedPDF(pQVar8,this,(string *)local_110,-1,(string *)local_1f8);
            __cxa_throw(pQVar8,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
          }
        }
      }
    } while (local_1d8 != 0);
    local_1d8 = 0;
  }
  _Var22._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  if (*(long *)&((_Var22._M_head_impl)->trailer).super_BaseHandle == 0) {
    pQVar8 = (QPDFExc *)__cxa_allocate_exception(0x80);
    local_110._0_8_ = local_110 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"");
    local_1f8._0_8_ = local_1f8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1f8,"unable to find trailer while reading xref","");
    damagedPDF(pQVar8,this,(string *)local_110,-1,(string *)local_1f8);
    __cxa_throw(pQVar8,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  local_110._0_8_ = local_110 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"/Size","");
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_1f8,(string *)&(_Var22._M_head_impl)->trailer);
  uVar3 = QPDFObjectHandle::getIntValueAsInt((QPDFObjectHandle *)local_1f8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_);
  }
  if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
    operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
  }
  _Var22._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  if (*(size_t *)((long)&(_Var22._M_head_impl)->xref_table + 0x28) == 0) {
    uVar19 = 0;
  }
  else {
    lVar4 = std::_Rb_tree_decrement
                      ((_Rb_tree_node_base *)((long)&(_Var22._M_head_impl)->xref_table + 8));
    uVar19 = *(uint *)(lVar4 + 0x20);
  }
  uVar18 = uVar19;
  if (*(size_t *)((long)&(_Var22._M_head_impl)->deleted_objects + 0x28) != 0) {
    lVar4 = std::_Rb_tree_decrement
                      ((_Rb_tree_node_base *)((long)&(_Var22._M_head_impl)->deleted_objects + 8));
    uVar18 = *(uint *)(lVar4 + 0x20);
    if ((int)*(uint *)(lVar4 + 0x20) < (int)uVar19) {
      uVar18 = uVar19;
    }
  }
  if ((0 < (int)uVar3) && (uVar3 - 1 == uVar18)) goto LAB_00226eb8;
  local_1f8._0_8_ = local_1f8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"");
  uVar19 = -uVar3;
  if (0 < (int)uVar3) {
    uVar19 = uVar3;
  }
  uVar21 = 1;
  if (9 < uVar19) {
    uVar15 = (ulong)uVar19;
    uVar10 = 4;
    do {
      uVar21 = uVar10;
      uVar9 = (uint)uVar15;
      if (uVar9 < 100) {
        uVar21 = uVar21 - 2;
        goto LAB_00226b10;
      }
      if (uVar9 < 1000) {
        uVar21 = uVar21 - 1;
        goto LAB_00226b10;
      }
      if (uVar9 < 10000) goto LAB_00226b10;
      uVar15 = uVar15 / 10000;
      uVar10 = uVar21 + 4;
    } while (99999 < uVar9);
    uVar21 = uVar21 + 1;
  }
LAB_00226b10:
  local_130[0] = local_120;
  std::__cxx11::string::_M_construct((ulong)local_130,(char)uVar21 - (char)((int)uVar3 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar3 >> 0x1f) + (long)local_130[0]),uVar21,uVar19);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)local_130,0,(char *)0x0,0x28315f);
  local_150 = &local_140;
  plVar11 = plVar5 + 2;
  if ((long *)*plVar5 == plVar11) {
    local_140 = *plVar11;
    lStack_138 = plVar5[3];
  }
  else {
    local_140 = *plVar11;
    local_150 = (long *)*plVar5;
  }
  local_148 = plVar5[1];
  *plVar5 = (long)plVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_150);
  puVar12 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar12) {
    local_180 = *puVar12;
    lStack_178 = plVar5[3];
    local_190 = &local_180;
  }
  else {
    local_180 = *puVar12;
    local_190 = (ulong *)*plVar5;
  }
  local_188 = plVar5[1];
  *plVar5 = (long)puVar12;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  uVar3 = -uVar18;
  if (0 < (int)uVar18) {
    uVar3 = uVar18;
  }
  uVar19 = 1;
  if (9 < uVar3) {
    uVar15 = (ulong)uVar3;
    uVar21 = 4;
    do {
      uVar19 = uVar21;
      uVar10 = (uint)uVar15;
      if (uVar10 < 100) {
        uVar19 = uVar19 - 2;
        goto LAB_00226c70;
      }
      if (uVar10 < 1000) {
        uVar19 = uVar19 - 1;
        goto LAB_00226c70;
      }
      if (uVar10 < 10000) goto LAB_00226c70;
      uVar15 = uVar15 / 10000;
      uVar21 = uVar19 + 4;
    } while (99999 < uVar10);
    uVar19 = uVar19 + 1;
  }
LAB_00226c70:
  local_170 = local_160;
  std::__cxx11::string::_M_construct((ulong)&local_170,(char)uVar19 - (char)((int)uVar18 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar18 >> 0x1f) + (long)local_170),uVar19,uVar3);
  uVar15 = 0xf;
  if (local_190 != &local_180) {
    uVar15 = local_180;
  }
  if (uVar15 < (ulong)(local_168 + local_188)) {
    uVar15 = 0xf;
    if (local_170 != local_160) {
      uVar15 = local_160[0];
    }
    if (uVar15 < (ulong)(local_168 + local_188)) goto LAB_00226cf4;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_170,0,(char *)0x0,(ulong)local_190);
  }
  else {
LAB_00226cf4:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_190,(ulong)local_170);
  }
  local_1d0 = &local_1c0;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_1c0 = *plVar5;
    uStack_1b8 = puVar6[3];
  }
  else {
    local_1c0 = *plVar5;
    local_1d0 = (long *)*puVar6;
  }
  local_1c8 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1d0);
  psVar13 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_1b0.field_2._M_allocated_capacity = *psVar13;
    local_1b0.field_2._8_8_ = plVar5[3];
    local_1b0._M_dataplus._M_p = (pointer)((long)&local_1b0 + 0x10U);
  }
  else {
    local_1b0.field_2._M_allocated_capacity = *psVar13;
    local_1b0._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_1b0._M_string_length = plVar5[1];
  *plVar5 = (long)psVar13;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  damagedPDF((QPDFExc *)local_110,this,(string *)local_1f8,-1,&local_1b0);
  warn(this,(QPDFExc *)local_110);
  QPDFExc::~QPDFExc((QPDFExc *)local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)((long)&local_1b0 + 0x10U)) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0,local_1c0 + 1);
  }
  if (local_170 != local_160) {
    operator_delete(local_170,local_160[0] + 1);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190,local_180 + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if (local_130[0] != local_120) {
    operator_delete(local_130[0],local_120[0] + 1);
  }
  if ((element_type *)local_1f8._0_8_ != (element_type *)(local_1f8 + 0x10)) {
    operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
  }
  _Var22._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
LAB_00226eb8:
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&((_Var22._M_head_impl)->deleted_objects)._M_t);
  _Var22._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  p_Var7 = *(_Base_ptr *)((long)&(_Var22._M_head_impl)->xref_table + 0x18);
  p_Var17 = (_Base_ptr)((long)&(_Var22._M_head_impl)->xref_table + 8);
  if (p_Var7 != p_Var17) {
    uVar15 = 0xffffffff;
    uVar23 = 0;
    do {
      if (0 < (int)p_Var7[1]._M_color && p_Var7[1]._M_color == (_Rb_tree_color)uVar15) {
        removeObject(this,(QPDFObjGen)(uVar23 | uVar15 & 0xffffffff));
      }
      uVar15 = *(ulong *)(p_Var7 + 1);
      uVar23 = uVar15 & 0xffffffff00000000;
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while (p_Var7 != p_Var17);
  }
  std::
  _Rb_tree<long_long,_long_long,_std::_Identity<long_long>,_std::less<long_long>,_std::allocator<long_long>_>
  ::~_Rb_tree(&local_90);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void
QPDF::read_xref(qpdf_offset_t xref_offset)
{
    std::map<int, int> free_table;
    std::set<qpdf_offset_t> visited;
    while (xref_offset) {
        visited.insert(xref_offset);
        char buf[7];
        memset(buf, 0, sizeof(buf));
        m->file->seek(xref_offset, SEEK_SET);
        // Some files miss the mark a little with startxref. We could do a better job of searching
        // in the neighborhood for something that looks like either an xref table or stream, but the
        // simple heuristic of skipping whitespace can help with the xref table case and is harmless
        // with the stream case.
        bool done = false;
        bool skipped_space = false;
        while (!done) {
            char ch;
            if (1 == m->file->read(&ch, 1)) {
                if (util::is_space(ch)) {
                    skipped_space = true;
                } else {
                    m->file->unreadCh(ch);
                    done = true;
                }
            } else {
                QTC::TC("qpdf", "QPDF eof skipping spaces before xref", skipped_space ? 0 : 1);
                done = true;
            }
        }

        m->file->read(buf, sizeof(buf) - 1);
        // The PDF spec says xref must be followed by a line terminator, but files exist in the wild
        // where it is terminated by arbitrary whitespace.
        if ((strncmp(buf, "xref", 4) == 0) && util::is_space(buf[4])) {
            if (skipped_space) {
                QTC::TC("qpdf", "QPDF xref skipped space");
                warn(damagedPDF("", -1, "extraneous whitespace seen before xref"));
            }
            QTC::TC(
                "qpdf",
                "QPDF xref space",
                ((buf[4] == '\n')       ? 0
                     : (buf[4] == '\r') ? 1
                     : (buf[4] == ' ')  ? 2
                                        : 9999));
            int skip = 4;
            // buf is null-terminated, and util::is_space('\0') is false, so this won't overrun.
            while (util::is_space(buf[skip])) {
                ++skip;
            }
            xref_offset = read_xrefTable(xref_offset + skip);
        } else {
            xref_offset = read_xrefStream(xref_offset);
        }
        if (visited.count(xref_offset) != 0) {
            QTC::TC("qpdf", "QPDF xref loop");
            throw damagedPDF("", -1, "loop detected following xref tables");
        }
    }

    if (!m->trailer) {
        throw damagedPDF("", -1, "unable to find trailer while reading xref");
    }
    int size = m->trailer.getKey("/Size").getIntValueAsInt();
    int max_obj = 0;
    if (!m->xref_table.empty()) {
        max_obj = m->xref_table.rbegin()->first.getObj();
    }
    if (!m->deleted_objects.empty()) {
        max_obj = std::max(max_obj, *(m->deleted_objects.rbegin()));
    }
    if ((size < 1) || (size - 1 != max_obj)) {
        QTC::TC("qpdf", "QPDF xref size mismatch");
        warn(damagedPDF(
            "",
            -1,
            ("reported number of objects (" + std::to_string(size) +
             ") is not one plus the highest object number (" + std::to_string(max_obj) + ")")));
    }

    // We no longer need the deleted_objects table, so go ahead and clear it out to make sure we
    // never depend on its being set.
    m->deleted_objects.clear();

    // Make sure we keep only the highest generation for any object.
    QPDFObjGen last_og{-1, 0};
    for (auto const& item: m->xref_table) {
        auto id = item.first.getObj();
        if (id == last_og.getObj() && id > 0) {
            removeObject(last_og);
        }
        last_og = item.first;
    }
}